

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_scalar_function_info.cpp
# Opt level: O3

void __thiscall
duckdb::AddScalarFunctionOverloadInfo::AddScalarFunctionOverloadInfo
          (AddScalarFunctionOverloadInfo *this,AlterEntryData *data,
          unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
          *new_overloads_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  AlterEntryData local_98;
  
  paVar2 = &local_98.catalog.field_2;
  local_98.catalog._M_dataplus._M_p = (data->catalog)._M_dataplus._M_p;
  paVar1 = &(data->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p == paVar1) {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.catalog.field_2._8_8_ = *(undefined8 *)((long)&(data->catalog).field_2 + 8);
    local_98.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.catalog._M_string_length = (data->catalog)._M_string_length;
  paVar3 = &local_98.schema.field_2;
  (data->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (data->catalog)._M_string_length = 0;
  (data->catalog).field_2._M_local_buf[0] = '\0';
  local_98.schema._M_dataplus._M_p = (data->schema)._M_dataplus._M_p;
  paVar1 = &(data->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p == paVar1) {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.schema.field_2._8_8_ = *(undefined8 *)((long)&(data->schema).field_2 + 8);
    local_98.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.schema._M_string_length = (data->schema)._M_string_length;
  paVar4 = &local_98.name.field_2;
  (data->schema)._M_dataplus._M_p = (pointer)paVar1;
  (data->schema)._M_string_length = 0;
  (data->schema).field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (data->name)._M_dataplus._M_p;
  paVar1 = &(data->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p == paVar1) {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.name.field_2._8_8_ = *(undefined8 *)((long)&(data->name).field_2 + 8);
    local_98.name._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.name._M_string_length = (data->name)._M_string_length;
  (data->name)._M_dataplus._M_p = (pointer)paVar1;
  (data->name)._M_string_length = 0;
  (data->name).field_2._M_local_buf[0] = '\0';
  local_98.if_not_found = data->if_not_found;
  AlterScalarFunctionInfo::AlterScalarFunctionInfo
            (&this->super_AlterScalarFunctionInfo,ADD_FUNCTION_OVERLOADS,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  (this->super_AlterScalarFunctionInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AddScalarFunctionOverloadInfo_0244fe60;
  (this->new_overloads).
  super_unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateScalarFunctionInfo_*,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  .super__Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false>._M_head_impl =
       (new_overloads_p->
       super_unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateScalarFunctionInfo_*,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       .super__Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false>._M_head_impl;
  (new_overloads_p->
  super_unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateScalarFunctionInfo_*,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  .super__Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false>._M_head_impl =
       (CreateScalarFunctionInfo *)0x0;
  (this->super_AlterScalarFunctionInfo).super_AlterInfo.allow_internal = true;
  return;
}

Assistant:

AddScalarFunctionOverloadInfo::AddScalarFunctionOverloadInfo(AlterEntryData data,
                                                             unique_ptr<CreateScalarFunctionInfo> new_overloads_p)
    : AlterScalarFunctionInfo(AlterScalarFunctionType::ADD_FUNCTION_OVERLOADS, std::move(data)),
      new_overloads(std::move(new_overloads_p)) {
	this->allow_internal = true;
}